

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

Any __thiscall amrex::MLLinOp::AnyMakeCoarseAmr(MLLinOp *this,int famrlev,IntVect *ng)

{
  DistributionMapping *dm;
  int ncomp;
  IntVect *in_RCX;
  undefined4 in_register_00000034;
  long *plVar1;
  long lVar2;
  IntVect ratio;
  BoxArray cba;
  FabFactory<amrex::FArrayBox> local_258;
  IntVect local_24c;
  MFInfo local_240;
  BoxArray local_218;
  MultiFab local_1b0;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,famrlev);
  lVar2 = (long)(int)ng * 0x18;
  BoxArray::BoxArray(&local_218,*(BoxArray **)(plVar1[0x16] + lVar2));
  local_24c.vect[0] = *(int *)(plVar1[7] + -4 + (long)(int)ng * 4);
  local_24c.vect[1] = local_24c.vect[0];
  local_24c.vect[2] = local_24c.vect[0];
  BoxArray::coarsen(&local_218,&local_24c);
  BoxArray::convert(&local_218,(IntVect *)(plVar1 + 0xe));
  dm = *(DistributionMapping **)(plVar1[0x19] + lVar2);
  ncomp = (**(code **)(*plVar1 + 0x28))(plVar1);
  local_240.alloc = true;
  local_240._1_7_ = 0;
  local_240.arena = (Arena *)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._vptr_FabFactory = (_func_int **)&PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&local_1b0,&local_218,dm,ncomp,in_RCX,&local_240,&local_258);
  Any::Any<amrex::MultiFab>((Any *)this,&local_1b0);
  MultiFab::~MultiFab(&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray(&local_218);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)this;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseAmr (int famrlev, IntVect const& ng) const
{
    BoxArray cba = m_grids[famrlev][0];
    IntVect ratio(AMRRefRatio(famrlev-1));
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[famrlev][0], getNComp(), ng));
}